

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IReaderWriter.h
# Opt level: O1

int __thiscall JetHead::IReaderWriter::readAll(IReaderWriter *this,void *buffer,int length)

{
  bool bVar1;
  uint uVar2;
  uint unaff_EBP;
  int bytesRead;
  uint uVar3;
  
  uVar3 = 0;
  do {
    if (length <= (int)uVar3) {
      return uVar3;
    }
    uVar2 = (*this->_vptr_IReaderWriter[2])(this,(ulong)uVar3 + (long)buffer);
    if ((int)uVar2 < 0) {
      bVar1 = false;
    }
    else if (uVar2 == 0) {
      bVar1 = false;
      uVar2 = uVar3;
    }
    else {
      uVar3 = uVar3 + uVar2;
      bVar1 = true;
      uVar2 = unaff_EBP;
    }
    unaff_EBP = uVar2;
  } while (bVar1);
  return uVar2;
}

Assistant:

virtual int readAll(void *buffer, int length)
		{
			int bytesRead = 0;
			
			while (bytesRead < length)
			{
				int result = read((uint8_t*)buffer + bytesRead,
								  length - bytesRead);
				
				if (result < 0)
					return result;
				
				if (result == 0)
					return bytesRead;
				
				bytesRead += result;
			}
			return bytesRead;
		}